

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_render_content.cpp
# Opt level: O1

bool __thiscall
ON_RenderContentPrivate::AddChild(ON_RenderContentPrivate *this,ON_RenderContent *child)

{
  ON_RenderContentPrivate *pOVar1;
  ON_RenderContent *pOVar2;
  ON_RenderContent *pOVar3;
  ON_RenderContent **ppOVar4;
  ON_RenderContent *result;
  
  pOVar1 = child->_private;
  if (((pOVar1->m_model == (ONX_Model *)0x0) && (pOVar1->m_parent == (ON_RenderContent *)0x0)) &&
     (pOVar1->m_next_sibling == (ON_RenderContent *)0x0)) {
    pOVar2 = this->m_first_child;
    if (this->m_first_child == (ON_RenderContent *)0x0) {
      ppOVar4 = &this->m_first_child;
    }
    else {
      do {
        pOVar3 = pOVar2;
        pOVar2 = pOVar3->_private->m_next_sibling;
      } while (pOVar2 != (ON_RenderContent *)0x0);
      ppOVar4 = &pOVar3->_private->m_next_sibling;
    }
    *ppOVar4 = child;
    pOVar1->m_next_sibling = (ON_RenderContent *)0x0;
    pOVar1->m_parent = this->m_render_content;
    return true;
  }
  return false;
}

Assistant:

bool ON_RenderContentPrivate::AddChild(ON_RenderContent& child)
{
  if ((nullptr != child._private->m_model) || (nullptr != child._private->m_parent) || (nullptr != child._private->m_next_sibling))
    return false;

  if (nullptr == m_first_child)
  {
    m_first_child = &child;
  }
  else
  {
    ON_RenderContent* last_child = FindLastChild();
    if (nullptr == last_child)
      return false;

    last_child->_private->m_next_sibling = &child;
  }

  child._private->m_next_sibling = nullptr;
  child._private->m_parent = &m_render_content;

  return true;
}